

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O0

void TestFastDtoaPrecisionVariousDoubles(void)

{
  Vector<char> representation;
  Vector<char> representation_00;
  Vector<char> representation_01;
  Vector<char> representation_02;
  Vector<char> representation_03;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  Vector<char> buffer_09;
  Vector<char> buffer_10;
  Vector<char> buffer_11;
  Vector<char> buffer_12;
  uint64_t largest_denormal64;
  double v;
  uint64_t smallest_normal64;
  double max_double;
  double min_double;
  bool status;
  int point;
  int length;
  Vector<char> buffer;
  char buffer_container [100];
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  int *piVar1;
  char *in_stack_fffffffffffffe28;
  int *piVar2;
  char *in_stack_fffffffffffffe30;
  int *file;
  undefined8 in_stack_fffffffffffffe38;
  int iVar3;
  char *in_stack_fffffffffffffe40;
  int *file_00;
  int *in_stack_fffffffffffffe48;
  int *decimal_point;
  int *in_stack_fffffffffffffe50;
  int *length_00;
  undefined8 in_stack_fffffffffffffe58;
  int *piVar4;
  Double in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  char *pcVar5;
  undefined8 in_stack_fffffffffffffe70;
  Double local_180;
  double local_178;
  undefined8 local_170;
  int *local_168;
  int *local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  int *local_140;
  int *local_138;
  int *local_130;
  int *local_128;
  int *local_120;
  int *local_118;
  int *local_110;
  int *local_108;
  int *local_100;
  int *local_f8;
  int *local_f0;
  undefined8 local_e8;
  int *local_e0;
  int *local_d8;
  undefined8 local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  undefined1 local_81;
  undefined1 local_78 [16];
  char local_68 [104];
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  local_98 = (int *)local_78._0_8_;
  local_90 = (int *)local_78._8_8_;
  buffer_00._8_8_ = in_stack_fffffffffffffe70;
  buffer_00.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_00,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  local_a8 = (int *)local_78._0_8_;
  local_a0 = (int *)local_78._8_8_;
  representation.start_._4_4_ = in_stack_fffffffffffffe1c;
  representation.start_._0_4_ = in_stack_fffffffffffffe18;
  representation._8_8_ = in_stack_fffffffffffffe20;
  TrimRepresentation(representation);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_b8 = (int *)local_78._0_8_;
  local_b0 = (int *)local_78._8_8_;
  buffer_01._8_8_ = in_stack_fffffffffffffe70;
  buffer_01.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_01,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  if ((bool)local_81) {
    CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
    local_c8 = (int *)local_78._0_8_;
    local_c0 = (int *)local_78._8_8_;
    representation_00.start_._4_4_ = in_stack_fffffffffffffe1c;
    representation_00.start_._0_4_ = in_stack_fffffffffffffe18;
    representation_00._8_8_ = in_stack_fffffffffffffe20;
    TrimRepresentation(representation_00);
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                      in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                      (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe1c);
  }
  local_d0 = 1;
  local_e0 = (int *)local_78._0_8_;
  local_d8 = (int *)local_78._8_8_;
  buffer_02._8_8_ = in_stack_fffffffffffffe70;
  buffer_02.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_02,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_e8 = 0x7fefffffffffffff;
  local_f8 = (int *)local_78._0_8_;
  local_f0 = (int *)local_78._8_8_;
  buffer_03._8_8_ = in_stack_fffffffffffffe70;
  buffer_03.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_03,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_108 = (int *)local_78._0_8_;
  local_100 = (int *)local_78._8_8_;
  buffer_04._8_8_ = in_stack_fffffffffffffe70;
  buffer_04.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_04,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  if ((bool)local_81) {
    CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
    local_118 = (int *)local_78._0_8_;
    local_110 = (int *)local_78._8_8_;
    representation_01.start_._4_4_ = in_stack_fffffffffffffe1c;
    representation_01.start_._0_4_ = in_stack_fffffffffffffe18;
    representation_01._8_8_ = in_stack_fffffffffffffe20;
    TrimRepresentation(representation_01);
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                      in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                      (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                      in_stack_fffffffffffffe1c);
  }
  local_128 = (int *)local_78._0_8_;
  local_120 = (int *)local_78._8_8_;
  buffer_05._8_8_ = in_stack_fffffffffffffe70;
  buffer_05.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_05,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_138 = (int *)local_78._0_8_;
  local_130 = (int *)local_78._8_8_;
  buffer_06._8_8_ = in_stack_fffffffffffffe70;
  buffer_06.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_06,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_148 = (int *)local_78._0_8_;
  local_140 = (int *)local_78._8_8_;
  buffer_07._8_8_ = in_stack_fffffffffffffe70;
  buffer_07.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_07,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_158 = (int *)local_78._0_8_;
  local_150 = (int *)local_78._8_8_;
  buffer_08._8_8_ = in_stack_fffffffffffffe70;
  buffer_08.start_ = in_stack_fffffffffffffe68;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_08,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  local_168 = (int *)local_78._0_8_;
  local_160 = (int *)local_78._8_8_;
  representation_02.start_._4_4_ = in_stack_fffffffffffffe1c;
  representation_02.start_._0_4_ = in_stack_fffffffffffffe18;
  representation_02._8_8_ = in_stack_fffffffffffffe20;
  TrimRepresentation(representation_02);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_170 = 0x10000000000000;
  double_conversion::Double::Double(&local_180,0x10000000000000);
  local_178 = double_conversion::Double::value((Double *)0x8642d2);
  buffer_09._8_8_ = local_78._0_8_;
  buffer_09.start_ = in_stack_fffffffffffffe68;
  piVar2 = (int *)local_78._0_8_;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,
                        (FastDtoaMode)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                        (int)in_stack_fffffffffffffe58,buffer_09,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper(in_stack_fffffffffffffe40,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  pcVar5 = (char *)0xfffffffffffff;
  double_conversion::Double::Double((Double *)&stack0xfffffffffffffe60,0xfffffffffffff);
  local_178 = double_conversion::Double::value((Double *)0x8643d7);
  buffer_10._8_8_ = piVar2;
  buffer_10.start_ = pcVar5;
  length_00 = (int *)local_78._0_8_;
  piVar4 = (int *)local_78._8_8_;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,SUB84(local_78._8_8_,4),
                        (int)local_78._8_8_,buffer_10,(int *)local_78._0_8_,
                        in_stack_fffffffffffffe48);
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  CheckHelper(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
              in_stack_fffffffffffffe20,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  representation_03.start_._4_4_ = in_stack_fffffffffffffe1c;
  representation_03.start_._0_4_ = in_stack_fffffffffffffe18;
  representation_03._8_8_ = in_stack_fffffffffffffe20;
  file_00 = (int *)local_78._0_8_;
  decimal_point = (int *)local_78._8_8_;
  TrimRepresentation(representation_03);
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper((char *)file_00,iVar3,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                    in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper((char *)file_00,iVar3,in_stack_fffffffffffffe30,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_178 = 3.316133905216739e-237;
  buffer_11._8_8_ = piVar2;
  buffer_11.start_ = pcVar5;
  file = (int *)local_78._0_8_;
  piVar1 = (int *)local_78._8_8_;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,(FastDtoaMode)((ulong)piVar4 >> 0x20)
                        ,(int)piVar4,buffer_11,length_00,decimal_point);
  iVar3 = (int)((ulong)piVar1 >> 0x20);
  CheckHelper((char *)file,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20
              ,SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper((char *)file_00,iVar3,(char *)file,in_stack_fffffffffffffe28,
                    in_stack_fffffffffffffe20,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper((char *)file_00,iVar3,(char *)file,
                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                    in_stack_fffffffffffffe1c);
  local_178 = 7.98851839160081e+191;
  buffer_12._8_8_ = piVar2;
  buffer_12.start_ = pcVar5;
  piVar1 = (int *)local_78._0_8_;
  piVar2 = (int *)local_78._8_8_;
  local_81 = double_conversion::FastDtoa
                       ((double)in_stack_fffffffffffffe60.d64_,(FastDtoaMode)((ulong)piVar4 >> 0x20)
                        ,(int)piVar4,buffer_12,length_00,decimal_point);
  CheckHelper((char *)file,(int)((ulong)piVar2 >> 0x20),(char *)piVar1,
              SUB41((uint)in_stack_fffffffffffffe1c >> 0x18,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper((char *)file_00,iVar3,(char *)file,(char *)piVar2,(char *)piVar1,
                    (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  CheckEqualsHelper((char *)file_00,iVar3,(char *)file,(int)((ulong)piVar2 >> 0x20),(char *)piVar1,
                    in_stack_fffffffffffffe1c);
  return;
}

Assistant:

TEST(FastDtoaPrecisionVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  status = FastDtoa(1.0, FAST_DTOA_PRECISION, 3, buffer, &length, &point);
  CHECK(status);
  CHECK(3 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  status = FastDtoa(1.5, FAST_DTOA_PRECISION, 10, buffer, &length, &point);
  if (status) {
    CHECK(10 >= length);
    TrimRepresentation(buffer);
    CHECK_EQ("15", buffer.start());
    CHECK_EQ(1, point);
  }

  double min_double = 5e-324;
  status = FastDtoa(min_double, FAST_DTOA_PRECISION, 5,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("49407", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  status = FastDtoa(max_double, FAST_DTOA_PRECISION, 7,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("1797693", buffer.start());
  CHECK_EQ(309, point);

  status = FastDtoa(4294967272.0, FAST_DTOA_PRECISION, 14,
                    buffer, &length, &point);
  if (status) {
    CHECK(14 >= length);
    TrimRepresentation(buffer);
    CHECK_EQ("4294967272", buffer.start());
    CHECK_EQ(10, point);
  }

  status = FastDtoa(4.1855804968213567e298, FAST_DTOA_PRECISION, 17,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("41855804968213567", buffer.start());
  CHECK_EQ(299, point);

  status = FastDtoa(5.5626846462680035e-309, FAST_DTOA_PRECISION, 1,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("6", buffer.start());
  CHECK_EQ(-308, point);

  status = FastDtoa(2147483648.0, FAST_DTOA_PRECISION, 5,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("21475", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.5844466002796428e+298, FAST_DTOA_PRECISION, 10,
                    buffer, &length, &point);
  CHECK(status);
  CHECK(10 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("35844466", buffer.start());
  CHECK_EQ(299, point);

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  status = FastDtoa(v, FAST_DTOA_PRECISION, 17, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("22250738585072014", buffer.start());
  CHECK_EQ(-307, point);

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  status = FastDtoa(v, FAST_DTOA_PRECISION, 17, buffer, &length, &point);
  CHECK(status);
  CHECK(20 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("22250738585072009", buffer.start());
  CHECK_EQ(-307, point);

  v = 3.3161339052167390562200598e-237;
  status = FastDtoa(v, FAST_DTOA_PRECISION, 18, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("331613390521673906", buffer.start());
  CHECK_EQ(-236, point);

  v = 7.9885183916008099497815232e+191;
  status = FastDtoa(v, FAST_DTOA_PRECISION, 4, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("7989", buffer.start());
  CHECK_EQ(192, point);
}